

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.c
# Opt level: O3

LY_ERR ly_set_add(ly_set *set,void *object,ly_bool list,uint32_t *index_p)

{
  lyd_node **pplVar1;
  ulong uVar2;
  LY_ERR LVar3;
  uint uVar4;
  
  if (set == (ly_set *)0x0) {
    LVar3 = LY_EINVAL;
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","set","ly_set_add");
  }
  else {
    uVar4 = set->count;
    if (list == '\0') {
      if ((ulong)uVar4 == 0) {
        uVar4 = 0;
      }
      else {
        uVar2 = 0;
        do {
          if ((set->field_2).dnodes[uVar2] == (lyd_node *)object) {
            if (index_p == (uint32_t *)0x0) {
              return LY_SUCCESS;
            }
            *index_p = (uint32_t)uVar2;
            return LY_SUCCESS;
          }
          uVar2 = uVar2 + 1;
        } while (uVar4 != uVar2);
      }
    }
    if (set->size == uVar4) {
      pplVar1 = (lyd_node **)realloc((set->field_2).dnodes,(ulong)(uVar4 + 8) << 3);
      if (pplVar1 == (lyd_node **)0x0) {
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_set_add");
        return LY_EMEM;
      }
      set->size = set->size + 8;
      (set->field_2).dnodes = pplVar1;
      uVar4 = set->count;
    }
    if (index_p != (uint32_t *)0x0) {
      *index_p = uVar4;
    }
    set->count = uVar4 + 1;
    (set->field_2).dnodes[uVar4] = (lyd_node *)object;
    LVar3 = LY_SUCCESS;
  }
  return LVar3;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_set_add(struct ly_set *set, const void *object, ly_bool list, uint32_t *index_p)
{
    void **new;

    LY_CHECK_ARG_RET(NULL, set, LY_EINVAL);

    if (!list) {
        /* search for duplication */
        for (uint32_t i = 0; i < set->count; i++) {
            if (set->objs[i] == object) {
                /* already in set */
                if (index_p) {
                    *index_p = i;
                }
                return LY_SUCCESS;
            }
        }
    }

    if (set->size == set->count) {
#define SET_SIZE_STEP 8
        new = realloc(set->objs, (set->size + SET_SIZE_STEP) * sizeof *(set->objs));
        LY_CHECK_ERR_RET(!new, LOGMEM(NULL), LY_EMEM);
        set->size += SET_SIZE_STEP;
        set->objs = new;
#undef SET_SIZE_STEP
    }

    if (index_p) {
        *index_p = set->count;
    }
    set->objs[set->count++] = (void *)object;

    return LY_SUCCESS;
}